

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_schnorrsig_tests(void)

{
  byte *pbVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  int iVar143;
  uint32_t uVar144;
  uint32_t uVar145;
  long lVar146;
  code *pcVar147;
  secp256k1_context *extraout_RAX;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *psVar148;
  ulong uVar149;
  ulong uVar150;
  ulong uVar151;
  size_t in_RCX;
  secp256k1_context *psVar152;
  ulong uVar153;
  uint uVar154;
  secp256k1_schnorrsig_extraparams *psVar156;
  code *unaff_RBP;
  int *piVar157;
  ulong uVar158;
  ulong uVar159;
  ulong uVar160;
  ulong uVar161;
  size_t in_R8;
  ulong uVar162;
  ulong uVar163;
  secp256k1_schnorrsig_extraparams *pubkey;
  ulong uVar164;
  secp256k1_schnorrsig_extraparams *psVar165;
  ulong uVar166;
  secp256k1_schnorrsig_extraparams *keypair;
  ulong uVar167;
  ulong uVar168;
  byte bVar169;
  ulong uVar170;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar *args [5];
  uchar nonce_z [32];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  secp256k1_fe sStackY_460;
  secp256k1_schnorrsig_extraparams *psStackY_438;
  secp256k1_schnorrsig_extraparams *psStackY_430;
  secp256k1_schnorrsig_extraparams *psStackY_428;
  secp256k1_schnorrsig_extraparams *psStackY_420;
  secp256k1_schnorrsig_extraparams *psStackY_418;
  secp256k1_schnorrsig_extraparams *psStackY_410;
  int local_3ec;
  _func_void_char_ptr_void_ptr *local_3e8;
  void *pvStack_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  secp256k1_schnorrsig_extraparams local_3b8;
  undefined1 local_398 [8];
  secp256k1_schnorrsig_extraparams *psStack_390;
  secp256k1_nonce_function_hardened *local_388;
  secp256k1_schnorrsig_extraparams *psStack_380;
  secp256k1_schnorrsig_extraparams *local_378;
  uchar auStack_370 [8];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  secp256k1_schnorrsig_extraparams local_338;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  secp256k1_schnorrsig_extraparams local_2f8;
  undefined8 uStack_2e0;
  secp256k1_nonce_function_hardened local_2d8 [4];
  secp256k1_schnorrsig_extraparams local_2b8;
  ulong local_290;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_228 [16];
  void *local_218;
  uchar auStack_210 [8];
  secp256k1_schnorrsig_extraparams local_208;
  uint64_t uStack_1f0;
  undefined1 local_1e8 [64];
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [16];
  void *local_158;
  uchar auStack_150 [72];
  secp256k1_schnorrsig_extraparams local_108 [4];
  secp256k1_schnorrsig_extraparams local_a8 [4];
  undefined1 local_48 [16];
  void *local_38;
  secp256k1_schnorrsig_extraparams *psVar155;
  secp256k1_schnorrsig_extraparams *pubkey_00;
  
  auStack_370 = (uchar  [8])local_378;
  psVar165 = &local_3b8;
  local_3b8.noncefp._0_5_ = 0x65636e6f6e;
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144d61;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = 0xf4bfbff746615b35;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  local_218 = (void *)0x5735866160217180;
  auStack_210[0] = 'T';
  auStack_210[1] = 0x9e;
  auStack_210[2] = 0xa2;
  auStack_210[3] = '!';
  auStack_210[4] = 'L';
  auStack_210[5] = '{';
  auStack_210[6] = 0xb0;
  auStack_210[7] = 'h';
  local_1e8._32_8_ = (void *)0x40;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144d95;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144da9;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonceBIP0340/challenge",0xb);
  local_228._0_8_ = 0x4eba7e7024dd3219;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  local_218 = (void *)0x4c44df973afbe4b1;
  auStack_210[0] = '9';
  auStack_210[1] = '\'';
  auStack_210[2] = 0xac;
  auStack_210[3] = 'J';
  auStack_210[4] = '\n';
  auStack_210[5] = 0x85;
  auStack_210[6] = 0x9e;
  auStack_210[7] = '$';
  local_1e8._32_8_ = (void *)0x40;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144dd1;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144de1;
  testrand256(local_2b8.magic);
  pubkey_00 = &local_2f8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144df1;
  testrand256(pubkey_00->magic);
  pubkey = (secp256k1_schnorrsig_extraparams *)&(&local_2f8)[1].noncefp;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e01;
  testrand256((uchar *)pubkey);
  psVar155 = (secp256k1_schnorrsig_extraparams *)local_3d8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e0e;
  testrand256((uchar *)psVar155);
  keypair = &local_2b8;
  local_388 = (secp256k1_nonce_function_hardened *)pubkey;
  psStack_380 = psVar165;
  local_398 = (undefined1  [8])&local_2b8;
  psStack_390 = pubkey_00;
  local_378 = psVar155;
  if (0 < COUNT) {
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    psVar155 = (secp256k1_schnorrsig_extraparams *)0x0;
    do {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e4f;
      nonce_function_bip340_bitflip((uchar **)keypair,0,0x20,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e61;
      nonce_function_bip340_bitflip((uchar **)keypair,1,0x20,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e73;
      nonce_function_bip340_bitflip((uchar **)keypair,2,0x20,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e85;
      nonce_function_bip340_bitflip((uchar **)keypair,3,0xd,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144e97;
      nonce_function_bip340_bitflip((uchar **)keypair,3,0xd,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144ea9;
      nonce_function_bip340_bitflip((uchar **)keypair,4,0x20,in_RCX,in_R8);
      uVar154 = (int)psVar155 + 1;
      psVar155 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar154;
    } while ((int)uVar154 < COUNT);
  }
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144ef3;
  iVar143 = nonce_function_bip340
                      (local_288,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,local_3b8.magic,0xd,(void *)0x0);
  if (iVar143 == 0) goto LAB_001473be;
  keypair = &local_3b8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144f0d;
  testrand_bytes_test(keypair->magic,0xd);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144f4b;
  iVar143 = nonce_function_bip340
                      (local_288,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,keypair->magic,0xd,(void *)0x0);
  pcVar147 = (code *)psVar165;
  if (iVar143 == 0) goto LAB_001473c3;
  if (0 < COUNT) {
    psVar155 = (secp256k1_schnorrsig_extraparams *)0x0;
    keypair = &local_338;
    pubkey_00 = &local_2b8;
    pubkey = &local_2f8;
    psVar165 = (secp256k1_schnorrsig_extraparams *)&(&local_2f8)[1].noncefp;
    unaff_RBP = (code *)&local_3b8;
    do {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144f91;
      uVar144 = testrand_int(0x1f);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144fbc;
      iVar143 = nonce_function_bip340
                          (keypair->magic,pubkey_00->magic,(ulong)(uVar144 & 0x1f),pubkey->magic,
                           (uchar *)psVar165,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar143 == 0) goto LAB_00147314;
      lVar146 = 0;
      while (local_288[lVar146] == local_338.magic[lVar146]) {
        lVar146 = lVar146 + 1;
        if (lVar146 == 0x20) goto LAB_001473b4;
      }
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x144fee;
      uVar144 = testrand_int(0xc);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145035;
      iVar143 = nonce_function_bip340
                          (keypair->magic,pubkey_00->magic,0x20,pubkey->magic,(uchar *)psVar165,
                           (uchar *)unaff_RBP,((ulong)uVar144 + 0xd) % 0xd,(void *)0x0);
      psVar156 = psVar155;
      if (iVar143 == 0) goto LAB_00147319;
      lVar146 = 0;
      while (local_288[lVar146] == local_338.magic[lVar146]) {
        lVar146 = lVar146 + 1;
        if (lVar146 == 0x20) goto LAB_001473b9;
      }
      uVar154 = (int)psVar155 + 1;
      psVar155 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar154;
      pcVar147 = (code *)psVar165;
    } while ((int)uVar154 < COUNT);
  }
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1450bc;
  iVar143 = nonce_function_bip340
                      (local_338.magic,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,local_3b8.magic,0xd,local_3d8);
  if (iVar143 == 0) goto LAB_001473c8;
  psVar148 = (secp256k1_context *)local_288;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145104;
  iVar143 = nonce_function_bip340
                      ((uchar *)psVar148,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,local_3b8.magic,0xd,(void *)0x0);
  psVar156 = psVar155;
  if (iVar143 == 0) goto LAB_001473cd;
  lVar146 = 0;
  do {
    if (local_338.magic[lVar146] != local_288[lVar146]) goto LAB_001476fe;
    lVar146 = lVar146 + 1;
  } while (lVar146 != 0x20);
  local_348 = (undefined1  [16])0x0;
  local_358 = (undefined1  [16])0x0;
  local_368 = (undefined1  [16])0x0;
  local_378 = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_370[0] = '\0';
  auStack_370[1] = '\0';
  auStack_370[2] = '\0';
  auStack_370[3] = '\0';
  auStack_370[4] = '\0';
  auStack_370[5] = '\0';
  auStack_370[6] = '\0';
  auStack_370[7] = '\0';
  local_388 = (secp256k1_nonce_function_hardened *)0x0;
  psStack_380 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_398 = (undefined1  [8])0x0;
  psStack_390 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_5_ = 0;
  local_3b8.noncefp._5_3_ = 0;
  local_48 = (undefined1  [16])0x0;
  local_38 = (void *)0x0;
  psVar156 = &local_2b8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14519f;
  testrand256(psVar156->magic);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1451ac;
  testrand256(local_2f8.magic);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1451b9;
  testrand256((uchar *)&(&local_2f8)[1].noncefp);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1451c3;
  testrand256(local_3d8);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1451da;
  iVar143 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,psVar156->magic);
  if (iVar143 == 0) goto LAB_001473d2;
  keypair = (secp256k1_schnorrsig_extraparams *)(auStack_150 + 0x48);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145201;
  iVar143 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,local_2f8.magic);
  if (iVar143 == 0) goto LAB_001473d7;
  psVar156 = local_a8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145228;
  iVar143 = secp256k1_keypair_create
                      (CTX,(secp256k1_keypair *)psVar156,(uchar *)&(&local_2f8)[1].noncefp);
  if (iVar143 == 0) goto LAB_001473dc;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14524e;
  iVar143 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                       (secp256k1_keypair *)local_168);
  if (iVar143 == 0) goto LAB_001473e1;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14526f;
  iVar143 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_1e8,(int *)0x0,
                       (secp256k1_keypair *)keypair);
  if (iVar143 == 0) goto LAB_001473e6;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145290;
  iVar143 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,(secp256k1_keypair *)psVar156);
  if (iVar143 == 0) goto LAB_001473eb;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1452f5;
  iVar143 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar148 = CTX;
  if (iVar143 == 0) goto LAB_001473f0;
  local_3ec = 0;
  local_3e8 = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_001473f5;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar148->illegal_callback).data = &local_3ec;
  psVar165 = (secp256k1_schnorrsig_extraparams *)pcVar147;
  do {
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14536a;
    iVar143 = secp256k1_schnorrsig_sign_internal
                        (psVar148,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0014741a;
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_0014741f;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14741a;
      run_schnorrsig_tests_cold_2();
LAB_0014741a:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14741f;
      run_schnorrsig_tests_cold_3();
      psVar148 = extraout_RAX_00;
LAB_0014741f:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147433;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1453fc;
    iVar143 = secp256k1_schnorrsig_sign_internal
                        (psVar148,local_338.magic,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00147444;
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_00147449;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147444;
      run_schnorrsig_tests_cold_4();
LAB_00147444:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147449;
      run_schnorrsig_tests_cold_5();
      psVar148 = extraout_RAX_01;
LAB_00147449:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14745d;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14548c;
    iVar143 = secp256k1_schnorrsig_sign_internal
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)0x0,
                         nonce_function_bip340,(void *)0x0);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0014746e;
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_00147473;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14746e;
      run_schnorrsig_tests_cold_6();
LAB_0014746e:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147473;
      run_schnorrsig_tests_cold_7();
      psVar148 = extraout_RAX_02;
LAB_00147473:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147487;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14551e;
    iVar143 = secp256k1_schnorrsig_sign_internal
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_398,
                         nonce_function_bip340,(void *)0x0);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      psVar148 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_00147498;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_0014749d;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147498;
      run_schnorrsig_tests_cold_8();
LAB_00147498:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14749d;
      run_schnorrsig_tests_cold_9();
      psVar148 = extraout_RAX_03;
LAB_0014749d:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474b1;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = STATIC_CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1455b7;
    iVar143 = secp256k1_schnorrsig_sign_internal
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar148 = STATIC_CTX;
    if (iVar143 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_001474c2;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145608;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           &local_3b8);
      psVar148 = CTX;
      if (iVar143 == 0) goto LAB_001474c7;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_001474cc;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474c2;
      run_schnorrsig_tests_cold_10();
LAB_001474c2:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474c7;
      run_schnorrsig_tests_cold_11();
LAB_001474c7:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474cc;
      run_schnorrsig_tests_cold_84();
      psVar148 = extraout_RAX_04;
LAB_001474cc:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474e0;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145673;
    iVar143 = secp256k1_schnorrsig_sign_custom
                        (psVar148,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_001474f1;
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_001474f6;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474f1;
      run_schnorrsig_tests_cold_12();
LAB_001474f1:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474f6;
      run_schnorrsig_tests_cold_13();
      psVar148 = extraout_RAX_05;
LAB_001474f6:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14750a;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1456fb;
    iVar143 = secp256k1_schnorrsig_sign_custom
                        (psVar148,local_338.magic,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0014751b;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14573f;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (psVar148,local_338.magic,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                           &local_3b8);
      psVar148 = CTX;
      if (iVar143 == 0) goto LAB_00147520;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00147525;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14751b;
      run_schnorrsig_tests_cold_14();
LAB_0014751b:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147520;
      run_schnorrsig_tests_cold_15();
LAB_00147520:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147525;
      run_schnorrsig_tests_cold_83();
      psVar148 = extraout_RAX_06;
LAB_00147525:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147539;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1457ab;
    iVar143 = secp256k1_schnorrsig_sign_custom
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)0x0,&local_3b8
                        );
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_0014754a;
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_0014754f;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14754a;
      run_schnorrsig_tests_cold_16();
LAB_0014754a:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14754f;
      run_schnorrsig_tests_cold_17();
      psVar148 = extraout_RAX_07;
LAB_0014754f:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147563;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145833;
    iVar143 = secp256k1_schnorrsig_sign_custom
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_398,
                         &local_3b8);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00147574;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145883;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      psVar148 = CTX;
      if (iVar143 == 0) goto LAB_00147579;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_0014757e;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147574;
      run_schnorrsig_tests_cold_18();
LAB_00147574:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147579;
      run_schnorrsig_tests_cold_19();
LAB_00147579:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14757e;
      run_schnorrsig_tests_cold_82();
      psVar148 = extraout_RAX_08;
LAB_0014757e:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147592;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1458f7;
    iVar143 = secp256k1_schnorrsig_sign_custom
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         (secp256k1_schnorrsig_extraparams *)local_48);
    psVar148 = CTX;
    if (iVar143 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      psVar148 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_001475a3;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_001475a8;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475a3;
      run_schnorrsig_tests_cold_20();
LAB_001475a3:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475a8;
      run_schnorrsig_tests_cold_21();
      psVar148 = extraout_RAX_09;
LAB_001475a8:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475bc;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = STATIC_CTX;
    }
    psVar152 = (secp256k1_context *)0x20;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145986;
    iVar143 = secp256k1_schnorrsig_sign_custom
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
    psVar148 = STATIC_CTX;
    if (iVar143 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar148->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_001475cd;
      psVar152 = (secp256k1_context *)0x20;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1459e1;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338.magic,local_3d8,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar143 == 0) goto LAB_001475d2;
      psVar152 = (secp256k1_context *)0x20;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145a0f;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,local_338.magic,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
      psVar148 = CTX;
      if (iVar143 == 0) goto LAB_001475d7;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      psVar152 = CTX;
      if (secp256k1_context_static == CTX) goto LAB_001475dc;
      pcVar147 = counting_callback_fn;
      (CTX->illegal_callback).fn = counting_callback_fn;
      piVar157 = &local_3ec;
      (psVar148->illegal_callback).data = piVar157;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475cd;
      run_schnorrsig_tests_cold_22();
LAB_001475cd:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475d2;
      run_schnorrsig_tests_cold_23();
LAB_001475d2:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475d7;
      run_schnorrsig_tests_cold_81();
LAB_001475d7:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475dc;
      run_schnorrsig_tests_cold_80();
LAB_001475dc:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1475f0;
      (*(psVar152->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar152->illegal_callback).data);
      pcVar147 = (CTX->illegal_callback).fn;
      piVar157 = (int *)(CTX->illegal_callback).data;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145a62;
    (*pcVar147)("sig64 != NULL",piVar157);
    psVar148 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar148->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_0014760f;
      pcVar147 = counting_callback_fn;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      piVar157 = &local_3ec;
      (psVar148->illegal_callback).data = piVar157;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14760f;
      run_schnorrsig_tests_cold_24();
      psVar148 = extraout_RAX_10;
LAB_0014760f:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147623;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      pcVar147 = (CTX->illegal_callback).fn;
      piVar157 = (int *)(CTX->illegal_callback).data;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145ac7;
    (*pcVar147)("msg != NULL || msglen == 0",piVar157);
    psVar148 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar148->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      pcVar147 = (code *)0x0;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145afe;
      iVar143 = secp256k1_schnorrsig_verify
                          (psVar148,local_338.magic,(uchar *)0x0,0,
                           (secp256k1_xonly_pubkey *)local_228);
      psVar148 = CTX;
      if (iVar143 != 0) goto LAB_00147642;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      pcVar147 = (code *)CTX;
      if (secp256k1_context_static == CTX) goto LAB_00147647;
      pcVar147 = counting_callback_fn;
      (CTX->illegal_callback).fn = counting_callback_fn;
      piVar157 = &local_3ec;
      (psVar148->illegal_callback).data = piVar157;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147642;
      run_schnorrsig_tests_cold_25();
LAB_00147642:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147647;
      run_schnorrsig_tests_cold_26();
LAB_00147647:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14765b;
      (*(((secp256k1_context *)pcVar147)->illegal_callback).fn)
                ("ctx != secp256k1_context_static",
                 (((secp256k1_context *)pcVar147)->illegal_callback).data);
      pcVar147 = (CTX->illegal_callback).fn;
      piVar157 = (int *)(CTX->illegal_callback).data;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145b51;
    (*pcVar147)("pubkey != NULL",piVar157);
    psVar148 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar148->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      local_3ec = 0;
      local_3e8 = (psVar148->illegal_callback).fn;
      pvStack_3e0 = (psVar148->illegal_callback).data;
      if (secp256k1_context_static == psVar148) goto LAB_0014767a;
      (psVar148->illegal_callback).fn = counting_callback_fn;
      (psVar148->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14767a;
      run_schnorrsig_tests_cold_27();
      psVar148 = extraout_RAX_11;
LAB_0014767a:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14768e;
      (*(psVar148->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
      psVar148 = CTX;
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145bcf;
    iVar143 = secp256k1_schnorrsig_verify
                        (psVar148,local_338.magic,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_288
                        );
    psVar152 = CTX;
    if (iVar143 != 0) {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14769f;
      run_schnorrsig_tests_cold_28();
LAB_0014769f:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476a4;
      run_schnorrsig_tests_cold_29();
LAB_001476a4:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476a9;
      run_schnorrsig_tests_cold_30();
LAB_001476a9:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476ae;
      run_schnorrsig_tests_cold_31();
LAB_001476ae:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476b3;
      run_schnorrsig_tests_cold_55();
LAB_001476b3:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476b8;
      run_schnorrsig_tests_cold_54();
LAB_001476b8:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476bd;
      run_schnorrsig_tests_cold_53();
LAB_001476bd:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476c2;
      run_schnorrsig_tests_cold_44();
LAB_001476c2:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476c7;
      run_schnorrsig_tests_cold_52();
LAB_001476c7:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476cc;
      run_schnorrsig_tests_cold_51();
LAB_001476cc:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476d1;
      run_schnorrsig_tests_cold_50();
LAB_001476d1:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476d6;
      run_schnorrsig_tests_cold_49();
LAB_001476d6:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476db;
      run_schnorrsig_tests_cold_48();
LAB_001476db:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476e0;
      run_schnorrsig_tests_cold_47();
LAB_001476e0:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476e5;
      run_schnorrsig_tests_cold_46();
LAB_001476e5:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476ea;
      run_schnorrsig_tests_cold_45();
LAB_001476ea:
      pcVar147 = (code *)pubkey_00;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476ef;
      run_schnorrsig_tests_cold_32();
LAB_001476ef:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476f4;
      run_schnorrsig_tests_cold_34();
      psVar155 = psVar156;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)pcVar147;
LAB_001476f4:
      pcVar147 = (code *)psVar165;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476f9;
      run_schnorrsig_tests_cold_36();
LAB_001476f9:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476fe;
      run_schnorrsig_tests_cold_37();
LAB_001476fe:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)secp256k1_ge_is_valid_var;
      run_schnorrsig_tests_cold_1();
      if ((int)(psVar148->ecmult_gen_ctx).ge_offset.y.n[0] == 0) {
        uVar153 = (psVar148->ecmult_gen_ctx).ge_offset.x.n[0];
        uVar158 = (psVar148->ecmult_gen_ctx).ge_offset.x.n[1];
        uVar161 = (psVar148->ecmult_gen_ctx).ge_offset.x.n[3];
        uVar151 = uVar153 * 2;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar161;
        auVar76._8_8_ = 0;
        auVar76._0_8_ = uVar151;
        uVar166 = (psVar148->ecmult_gen_ctx).ge_offset.x.n[2];
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar166;
        auVar77._8_8_ = 0;
        auVar77._0_8_ = uVar158 * 2;
        uVar2 = (psVar148->ecmult_gen_ctx).ge_offset.x.n[4];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar2;
        auVar78._8_8_ = 0;
        auVar78._0_8_ = uVar2;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = SUB168(auVar5 * auVar78,0);
        auVar131 = auVar3 * auVar76 + auVar4 * auVar77 + auVar6 * ZEXT816(0x1000003d10);
        uVar2 = uVar2 * 2;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar2;
        auVar79._8_8_ = 0;
        auVar79._0_8_ = uVar153;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar161;
        auVar80._8_8_ = 0;
        auVar80._0_8_ = uVar158 * 2;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar166;
        auVar81._8_8_ = 0;
        auVar81._0_8_ = uVar166;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = SUB168(auVar5 * auVar78,8);
        auVar3 = auVar10 * ZEXT816(0x1000003d10000) +
                 auVar7 * auVar79 + auVar9 * auVar81 + auVar8 * auVar80 + (auVar131 >> 0x34);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar153;
        auVar82._8_8_ = 0;
        auVar82._0_8_ = uVar153;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar2;
        auVar83._8_8_ = 0;
        auVar83._0_8_ = uVar158;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = uVar161;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = uVar166 * 2;
        auVar4 = auVar13 * auVar84 + auVar12 * auVar83 + (auVar3 >> 0x34);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar3._6_2_ & 0xf);
        auVar5 = auVar14 * ZEXT816(0x1000003d1) + auVar11 * auVar82;
        uVar149 = auVar5._0_8_;
        uVar153 = auVar5._8_8_;
        auVar142._8_8_ = uVar153 >> 0x34;
        auVar142._0_8_ = uVar153 * 0x1000 | uVar149 >> 0x34;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar158;
        auVar85._8_8_ = 0;
        auVar85._0_8_ = uVar151;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar2;
        auVar86._8_8_ = 0;
        auVar86._0_8_ = uVar166;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar161;
        auVar87._8_8_ = 0;
        auVar87._0_8_ = uVar161;
        auVar4 = auVar17 * auVar87 + auVar16 * auVar86 + (auVar4 >> 0x34);
        auVar18._8_8_ = 0;
        auVar18._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        auVar142 = auVar18 * ZEXT816(0x1000003d10) + auVar15 * auVar85 + auVar142;
        uVar150 = auVar142._0_8_;
        uVar153 = auVar142._8_8_;
        auVar132._8_8_ = uVar153 >> 0x34;
        auVar132._0_8_ = uVar153 * 0x1000 | uVar150 >> 0x34;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar166;
        auVar88._8_8_ = 0;
        auVar88._0_8_ = uVar151;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = uVar158;
        auVar89._8_8_ = 0;
        auVar89._0_8_ = uVar158;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = uVar2;
        auVar90._8_8_ = 0;
        auVar90._0_8_ = uVar161;
        auVar4 = auVar21 * auVar90 + (auVar4 >> 0x34);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = auVar4._0_8_;
        auVar132 = auVar22 * ZEXT816(0x1000003d10) + auVar20 * auVar89 + auVar19 * auVar88 +
                   auVar132;
        auVar5 = auVar132 >> 0x34;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = auVar5._0_8_;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = auVar4._8_8_;
        auVar136._8_8_ = auVar5._8_8_;
        auVar136._0_8_ = auVar131._0_8_ & 0xffffffffffffe;
        auVar137 = auVar23 * ZEXT816(0x1000003d10000) + auVar136 + auVar137;
        uVar159 = auVar137._0_8_;
        uVar153 = *(ulong *)&psVar148->ecmult_gen_ctx;
        uVar158 = (psVar148->ecmult_gen_ctx).scalar_offset.d[2];
        uVar151 = uVar153 * 2;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = uVar158;
        auVar91._8_8_ = 0;
        auVar91._0_8_ = uVar151;
        uVar161 = (psVar148->ecmult_gen_ctx).scalar_offset.d[0];
        uVar166 = (psVar148->ecmult_gen_ctx).scalar_offset.d[1];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar166;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = uVar161 * 2;
        uVar2 = (psVar148->ecmult_gen_ctx).scalar_offset.d[3];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar2;
        auVar93._8_8_ = 0;
        auVar93._0_8_ = uVar2;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = SUB168(auVar26 * auVar93,0);
        auVar131 = auVar27 * ZEXT816(0x1000003d10) + auVar25 * auVar92 + auVar24 * auVar91;
        uVar163 = uVar2 * 2;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar163;
        auVar94._8_8_ = 0;
        auVar94._0_8_ = uVar153;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar158;
        auVar95._8_8_ = 0;
        auVar95._0_8_ = uVar161 * 2;
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar166;
        auVar96._8_8_ = 0;
        auVar96._0_8_ = uVar166;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = SUB168(auVar26 * auVar93,8);
        auVar6 = auVar31 * ZEXT816(0x1000003d10000) +
                 auVar28 * auVar94 + auVar30 * auVar96 + auVar29 * auVar95 + (auVar131 >> 0x34);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = uVar153;
        auVar97._8_8_ = 0;
        auVar97._0_8_ = uVar153;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = uVar163;
        auVar98._8_8_ = 0;
        auVar98._0_8_ = uVar161;
        auVar34._8_8_ = 0;
        auVar34._0_8_ = uVar158;
        auVar99._8_8_ = 0;
        auVar99._0_8_ = uVar166 * 2;
        auVar4 = auVar34 * auVar99 + auVar33 * auVar98 + (auVar6 >> 0x34);
        auVar35._8_8_ = 0;
        auVar35._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar6._6_2_ & 0xf);
        auVar5 = auVar35 * ZEXT816(0x1000003d1) + auVar32 * auVar97;
        auVar36._8_8_ = 0;
        auVar36._0_8_ = uVar161;
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar151;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = uVar163;
        auVar101._8_8_ = 0;
        auVar101._0_8_ = uVar166;
        auVar38._8_8_ = 0;
        auVar38._0_8_ = uVar158;
        auVar102._8_8_ = 0;
        auVar102._0_8_ = uVar158;
        auVar4 = auVar38 * auVar102 + auVar37 * auVar101 + (auVar4 >> 0x34);
        auVar39._8_8_ = 0;
        auVar39._0_8_ = auVar4._0_8_ & 0xfffffffffffff;
        auVar7 = (auVar5 >> 0x34) + auVar36 * auVar100 + auVar39 * ZEXT816(0x1000003d10);
        uVar160 = auVar7._0_8_;
        uVar162 = auVar7._8_8_;
        auVar40._8_8_ = 0;
        auVar40._0_8_ = uVar166;
        auVar103._8_8_ = 0;
        auVar103._0_8_ = uVar151;
        auVar133._8_8_ = uVar162 >> 0x34;
        auVar133._0_8_ = uVar162 * 0x1000 | uVar160 >> 0x34;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = uVar161;
        auVar104._8_8_ = 0;
        auVar104._0_8_ = uVar161;
        auVar42._8_8_ = 0;
        auVar42._0_8_ = uVar163;
        auVar105._8_8_ = 0;
        auVar105._0_8_ = uVar158;
        auVar4 = auVar42 * auVar105 + (auVar4 >> 0x34);
        auVar43._8_8_ = 0;
        auVar43._0_8_ = auVar4._0_8_;
        auVar133 = auVar40 * auVar103 + auVar41 * auVar104 + auVar43 * ZEXT816(0x1000003d10) +
                   auVar133;
        auVar7 = auVar133 >> 0x34;
        auVar138._8_8_ = auVar7._8_8_;
        auVar138._0_8_ = auVar131._0_8_ & 0xffffffffffffe;
        auVar139._8_8_ = 0;
        auVar139._0_8_ = auVar7._0_8_;
        auVar44._8_8_ = 0;
        auVar44._0_8_ = auVar4._8_8_;
        auVar139 = auVar44 * ZEXT816(0x1000003d10000) + auVar138 + auVar139;
        uVar163 = auVar139._0_8_;
        uVar151 = auVar5._0_8_ & 0xfffffffffffff;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar151;
        auVar106._8_8_ = 0;
        auVar106._0_8_ = uVar158;
        uVar170 = (auVar139._8_8_ << 0xc | uVar163 >> 0x34) + (auVar6._0_8_ & 0xffffffffffff);
        uVar160 = uVar160 & 0xfffffffffffff;
        auVar46._8_8_ = 0;
        auVar46._0_8_ = uVar160;
        auVar107._8_8_ = 0;
        auVar107._0_8_ = uVar166;
        uVar167 = auVar133._0_8_ & 0xfffffffffffff;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar167;
        auVar108._8_8_ = 0;
        auVar108._0_8_ = uVar161;
        uVar163 = uVar163 & 0xfffffffffffff;
        auVar48._8_8_ = 0;
        auVar48._0_8_ = uVar163;
        auVar109._8_8_ = 0;
        auVar109._0_8_ = uVar153;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = uVar170;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = uVar2;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = SUB168(auVar49 * auVar110,0);
        auVar5 = auVar46 * auVar107 + auVar45 * auVar106 + auVar47 * auVar108 + auVar48 * auVar109 +
                 auVar50 * ZEXT816(0x1000003d10);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar151;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = uVar2;
        auVar52._8_8_ = 0;
        auVar52._0_8_ = uVar160;
        auVar112._8_8_ = 0;
        auVar112._0_8_ = uVar158;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = uVar167;
        auVar113._8_8_ = 0;
        auVar113._0_8_ = uVar166;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar163;
        auVar114._8_8_ = 0;
        auVar114._0_8_ = uVar161;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar170;
        auVar115._8_8_ = 0;
        auVar115._0_8_ = uVar153;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = SUB168(auVar49 * auVar110,8);
        auVar131 = auVar56 * ZEXT816(0x1000003d10000) +
                   auVar55 * auVar115 +
                   auVar54 * auVar114 + auVar53 * auVar113 + auVar52 * auVar112 + auVar51 * auVar111
                   + (auVar5 >> 0x34);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = uVar151;
        auVar116._8_8_ = 0;
        auVar116._0_8_ = uVar153;
        auVar58._8_8_ = 0;
        auVar58._0_8_ = uVar160;
        auVar117._8_8_ = 0;
        auVar117._0_8_ = uVar2;
        auVar59._8_8_ = 0;
        auVar59._0_8_ = uVar167;
        auVar118._8_8_ = 0;
        auVar118._0_8_ = uVar158;
        auVar60._8_8_ = 0;
        auVar60._0_8_ = uVar163;
        auVar119._8_8_ = 0;
        auVar119._0_8_ = uVar166;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = uVar170;
        auVar120._8_8_ = 0;
        auVar120._0_8_ = uVar161;
        auVar4 = auVar61 * auVar120 + auVar60 * auVar119 + auVar59 * auVar118 + auVar58 * auVar117 +
                 (auVar131 >> 0x34);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = (auVar4._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar131._6_2_ & 0xf);
        auVar6 = auVar62 * ZEXT816(0x1000003d1) + auVar57 * auVar116;
        uVar162 = auVar6._0_8_;
        uVar164 = auVar6._8_8_;
        auVar134._8_8_ = uVar164 >> 0x34;
        auVar134._0_8_ = uVar164 * 0x1000 | uVar162 >> 0x34;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = uVar151;
        auVar121._8_8_ = 0;
        auVar121._0_8_ = uVar161;
        auVar64._8_8_ = 0;
        auVar64._0_8_ = uVar160;
        auVar122._8_8_ = 0;
        auVar122._0_8_ = uVar153;
        auVar65._8_8_ = 0;
        auVar65._0_8_ = uVar167;
        auVar123._8_8_ = 0;
        auVar123._0_8_ = uVar2;
        auVar66._8_8_ = 0;
        auVar66._0_8_ = uVar163;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = uVar158;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = uVar170;
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar166;
        auVar4 = (auVar4 >> 0x34) + auVar67 * auVar125 + auVar66 * auVar124 + auVar65 * auVar123;
        uVar168 = auVar4._0_8_;
        uVar164 = auVar4._8_8_;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = uVar168 & 0xfffffffffffff;
        auVar134 = auVar68 * ZEXT816(0x1000003d10) + auVar64 * auVar122 + auVar63 * auVar121 +
                   auVar134;
        auVar135._8_8_ = uVar164 >> 0x34;
        auVar135._0_8_ = uVar164 * 0x1000 | uVar168 >> 0x34;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = uVar151;
        auVar126._8_8_ = 0;
        auVar126._0_8_ = uVar166;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = uVar160;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = uVar161;
        auVar71._8_8_ = 0;
        auVar71._0_8_ = uVar167;
        auVar128._8_8_ = 0;
        auVar128._0_8_ = uVar153;
        auVar72._8_8_ = 0;
        auVar72._0_8_ = uVar163;
        auVar129._8_8_ = 0;
        auVar129._0_8_ = uVar2;
        auVar73._8_8_ = 0;
        auVar73._0_8_ = uVar170;
        auVar130._8_8_ = 0;
        auVar130._0_8_ = uVar158;
        auVar135 = auVar73 * auVar130 + auVar72 * auVar129 + auVar135;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = auVar135._0_8_;
        auVar4 = auVar74 * ZEXT816(0x1000003d10) +
                 auVar71 * auVar128 + auVar70 * auVar127 + auVar69 * auVar126 + (auVar134 >> 0x34);
        auVar6 = auVar4 >> 0x34;
        auVar141._8_8_ = 0;
        auVar141._0_8_ = auVar6._0_8_;
        auVar75._8_8_ = 0;
        auVar75._0_8_ = auVar135._8_8_;
        auVar140._8_8_ = auVar6._8_8_;
        auVar140._0_8_ = auVar5._0_8_ & 0xfffffffffffff;
        auVar141 = auVar75 * ZEXT816(0x1000003d10000) + auVar140 + auVar141;
        uVar153 = auVar141._0_8_;
        sStackY_460.n[0] =
             ((uVar162 & 0xfffffffffffff) - (uVar149 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
        sStackY_460.n[1] =
             ((auVar134._0_8_ & 0xfffffffffffff) - (uVar150 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        sStackY_460.n[2] =
             ((auVar4._0_8_ & 0xfffffffffffff) - (auVar132._0_8_ & 0xfffffffffffff)) +
             0x3ffffffffffffc;
        sStackY_460.n[3] =
             ((uVar153 & 0xfffffffffffff) - (uVar159 & 0xfffffffffffff)) + 0x3ffffffffffffc;
        sStackY_460.n[4] =
             ((auVar131._0_8_ & 0xffffffffffff) -
             ((auVar137._8_8_ << 0xc | uVar159 >> 0x34) + (auVar3._0_8_ & 0xffffffffffff))) +
             0x3fffffffffffc + (auVar141._8_8_ << 0xc | uVar153 >> 0x34);
        psStackY_438 = psVar155;
        psStackY_430 = pubkey;
        psStackY_428 = (secp256k1_schnorrsig_extraparams *)pcVar147;
        psStackY_420 = keypair;
        psStackY_418 = pubkey_00;
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)unaff_RBP;
        secp256k1_fe_impl_normalizes_to_zero(&sStackY_460);
        return;
      }
      return;
    }
    (CTX->illegal_callback).fn = local_3e8;
    (psVar152->illegal_callback).data = pvStack_3e0;
    if (local_3ec != 1) goto LAB_0014769f;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145c11;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228._0_8_ = 0x239253819cecba11;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
    local_218 = (void *)0x3cc76597c87550;
    auStack_210[0] = 'd';
    auStack_210[1] = '\x11';
    auStack_210[2] = 0xf6;
    auStack_210[3] = 0x90;
    auStack_210[4] = 'j';
    auStack_210[5] = 0xb6;
    auStack_210[6] = 0xe9;
    auStack_210[7] = '3';
    local_1e8._32_8_ = (void *)0x40;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145c41;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_218 = (void *)0x0;
    auStack_210[0] = '\0';
    auStack_210[1] = '\0';
    auStack_210[2] = '\0';
    auStack_210[3] = '\0';
    auStack_210[4] = '\0';
    auStack_210[5] = '\0';
    auStack_210[6] = '\0';
    auStack_210[7] = '\x03';
    local_228._0_8_ = 0;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_388 = (secp256k1_nonce_function_hardened *)0xb0996f8345c831b5;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
    local_398[0] = 0xf9;
    local_398[1] = '0';
    local_398[2] = 0x8a;
    local_398[3] = '\x01';
    local_398._4_4_ = 0x10c35892;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x29529df8854f3449;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_338.ndata = (void *)0x0;
    uStack_320 = 0;
    local_338.magic[0] = '\0';
    local_338.magic[1] = '\0';
    local_338.magic[2] = '\0';
    local_338.magic[3] = '\0';
    local_338._4_4_ = 0;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x0;
    auStack_150[0x18] = 0xeb;
    auStack_150[0x19] = 0xee;
    auStack_150[0x1a] = 0xe8;
    auStack_150[0x1b] = 0xfd;
    auStack_150[0x1c] = 0xb2;
    auStack_150[0x1d] = '\x17';
    auStack_150[0x1e] = '/';
    auStack_150[0x1f] = 'G';
    auStack_150[0x20] = '}';
    auStack_150[0x21] = 0xf4;
    auStack_150[0x22] = 0x90;
    auStack_150[0x23] = '\r';
    auStack_150[0x24] = '1';
    auStack_150[0x25] = '\x05';
    auStack_150[0x26] = '6';
    auStack_150[0x27] = 0xc0;
    auStack_150[8] = '%';
    auStack_150[9] = 0xf6;
    auStack_150[10] = 'j';
    auStack_150[0xb] = 'J';
    auStack_150[0xc] = 0x85;
    auStack_150[0xd] = 0xea;
    auStack_150[0xe] = 0x8b;
    auStack_150[0xf] = 'q';
    auStack_150[0x10] = 0xe4;
    auStack_150[0x11] = 0x82;
    auStack_150[0x12] = 0xa7;
    auStack_150[0x13] = 'O';
    auStack_150[0x14] = '8';
    auStack_150[0x15] = '-';
    auStack_150[0x16] = ',';
    auStack_150[0x17] = 0xe5;
    local_158 = (void *)0x8b007835f1cdf4b;
    auStack_150[0] = 'L';
    auStack_150[1] = 'U';
    auStack_150[2] = 0xf1;
    auStack_150[3] = 0xce;
    auStack_150[4] = '-';
    auStack_150[5] = 0xca;
    auStack_150[6] = 0x82;
    auStack_150[7] = '\x15';
    local_168[0] = 0xe9;
    local_168[1] = '\a';
    local_168[2] = 0x83;
    local_168[3] = '\x1f';
    local_168._4_4_ = 0x108d8480;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x361024401b37a569;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145cf2;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338.magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145d0b;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,0x20,local_168,1);
    local_218 = (void *)0x56dab4380f16e762;
    auStack_210[0] = 0xa7;
    auStack_210[1] = 0x84;
    auStack_210[2] = 0xd9;
    auStack_210[3] = '\x04';
    auStack_210[4] = 'Q';
    auStack_210[5] = 0x90;
    auStack_210[6] = 0xcf;
    auStack_210[7] = 0xef;
    local_228._0_8_ = 0x6a2aed8a6251e1b7;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
    local_388 = (secp256k1_nonce_function_hardened *)0xd8cedea21daefe58;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
    local_398[0] = 0xdf;
    local_398[1] = 0xf1;
    local_398[2] = 0xd7;
    local_398[3] = '\x7f';
    local_398._4_4_ = 0x5f1c672a;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xbe4123db26371836;
    local_278._0_8_ = (void *)0x0;
    local_278._8_8_ = 0x100000000000000;
    local_288 = ZEXT816(0);
    local_338.ndata = (void *)0xd0319f29223809a4;
    uStack_320 = 0x896c4eec98fa2e08;
    local_338.magic[0] = '$';
    local_338.magic[1] = '?';
    local_338.magic[2] = 'j';
    local_338.magic[3] = 0x88;
    local_338._4_4_ = 0xd308a385;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_150[0x18] = 0x89;
    auStack_150[0x19] = '~';
    auStack_150[0x1a] = 0xfc;
    auStack_150[0x1b] = 0xb6;
    auStack_150[0x1c] = '9';
    auStack_150[0x1d] = 0xea;
    auStack_150[0x1e] = 0x87;
    auStack_150[0x1f] = '\x1c';
    auStack_150[0x20] = 0xfa;
    auStack_150[0x21] = 0x95;
    auStack_150[0x22] = 0xf6;
    auStack_150[0x23] = 0xde;
    auStack_150[0x24] = '3';
    auStack_150[0x25] = 0x9e;
    auStack_150[0x26] = 'K';
    auStack_150[0x27] = '\n';
    auStack_150[8] = 0x89;
    auStack_150[9] = '\x06';
    auStack_150[10] = 0xd1;
    auStack_150[0xb] = '\x1a';
    auStack_150[0xc] = 0xc9;
    auStack_150[0xd] = 'v';
    auStack_150[0xe] = 0xab;
    auStack_150[0xf] = 0xcc;
    auStack_150[0x10] = 0xb2;
    auStack_150[0x11] = '\v';
    auStack_150[0x12] = '\t';
    auStack_150[0x13] = '\x12';
    auStack_150[0x14] = 0x92;
    auStack_150[0x15] = 0xbf;
    auStack_150[0x16] = 0xf4;
    auStack_150[0x17] = 0xea;
    local_158 = (void *)0x17f9436d3e41de1b;
    auStack_150[0] = 0xdc;
    auStack_150[1] = 0x8d;
    auStack_150[2] = 0xcf;
    auStack_150[3] = 0x8c;
    auStack_150[4] = 'x';
    auStack_150[5] = 0xde;
    auStack_150[6] = '3';
    auStack_150[7] = 'A';
    local_168[0] = 'h';
    local_168[1] = 0x96;
    local_168[2] = 0xbd;
    local_168[3] = '`';
    local_168._4_4_ = 0x6d29aeee;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x7fe1df79f228ab4;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145dd8;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338.magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145df1;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,0x20,local_168,1);
    local_218 = (void *)0x74cc678a084e0229;
    auStack_210[0] = '\x02';
    auStack_210[1] = '\v';
    auStack_210[2] = 0xbe;
    auStack_210[3] = 0xa6;
    auStack_210[4] = ';';
    auStack_210[5] = '\x14';
    auStack_210[6] = 0xe5;
    auStack_210[7] = 0xc9;
    local_228._0_8_ = 0x34c26821a2da0fc9;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
    local_388 = (secp256k1_nonce_function_hardened *)0xc986b00953713901;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
    local_398[0] = 0xdd;
    local_398[1] = '0';
    local_398[2] = 0x8a;
    local_398[3] = 0xfe;
    local_398._4_4_ = 0x137e77c5;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xccb7c19c2ba71f12;
    local_278._8_8_ = 0x6d9e698d7620b4b;
    local_278._0_8_ = 0x2c69d1c6cd760e08;
    local_288._8_8_ = 0xccbcbbb5a235b02e;
    local_288._0_8_ = 0xaed7b42438a57ac8;
    local_338.ndata = (void *)0x33776cb5aa0598da;
    uStack_320 = 0x5cb708a5d0b92430;
    local_338.magic[0] = '~';
    local_338.magic[1] = '-';
    local_338.magic[2] = 'X';
    local_338.magic[3] = 0xd8;
    local_338._4_4_ = 0x1adfbcb3;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
    auStack_150[0x18] = 'z';
    auStack_150[0x19] = 0xde;
    auStack_150[0x1a] = 0xa9;
    auStack_150[0x1b] = 0x8d;
    auStack_150[0x1c] = 0x82;
    auStack_150[0x1d] = 0xf8;
    auStack_150[0x1e] = 'H';
    auStack_150[0x1f] = '\x1e';
    auStack_150[0x20] = '\x0e';
    auStack_150[0x21] = '\x1e';
    auStack_150[0x22] = '\x03';
    auStack_150[0x23] = 'g';
    auStack_150[0x24] = 'J';
    auStack_150[0x25] = 'o';
    auStack_150[0x26] = '?';
    auStack_150[0x27] = 0xb7;
    auStack_150[8] = 0xab;
    auStack_150[9] = 't';
    auStack_150[10] = 'X';
    auStack_150[0xb] = 'y';
    auStack_150[0xc] = 0xa5;
    auStack_150[0xd] = 0xad;
    auStack_150[0xe] = 0x95;
    auStack_150[0xf] = 'J';
    auStack_150[0x10] = 'r';
    auStack_150[0x11] = 0xc4;
    auStack_150[0x12] = 'Z';
    auStack_150[0x13] = 0x91;
    auStack_150[0x14] = 0xc3;
    auStack_150[0x15] = 0xa5;
    auStack_150[0x16] = '\x1d';
    auStack_150[0x17] = '<';
    local_158 = (void *)0x8b8d72602acf9bc4;
    auStack_150[0] = 'L';
    auStack_150[1] = ' ';
    auStack_150[2] = '\x0f';
    auStack_150[3] = 'P';
    auStack_150[4] = 0xdd;
    auStack_150[5] = '1';
    auStack_150[6] = '<';
    auStack_150[7] = '\x1b';
    local_168[0] = 'X';
    local_168[1] = '1';
    local_168[2] = 0xaa;
    local_168[3] = 0xee;
    local_168._4_4_ = 0xb74bb4d7;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x94429dba94ab5e4e;
    psVar165 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145eba;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar165,local_398,local_288,local_338.magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145ed3;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,0x20,local_168,1);
    local_218 = (void *)0x54a23fcf62307712;
    auStack_210[0] = 0x9e;
    auStack_210[1] = 'D';
    auStack_210[2] = 0xf5;
    auStack_210[3] = 0x8e;
    auStack_210[4] = 0xd2;
    auStack_210[5] = '@';
    auStack_210[6] = '\x17';
    auStack_210[7] = '\x10';
    local_228._0_8_ = 0x81739377262b430b;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
    local_388 = (secp256k1_nonce_function_hardened *)0x8a461df2fb950d3a;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
    local_398[0] = '%';
    local_398[1] = 0xd1;
    local_398[2] = 0xdf;
    local_398[3] = 0xf9;
    local_398._4_4_ = 0x25f50551;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xad96a928f622403c;
    local_278._8_4_ = 0xffffffff;
    local_278._0_8_ = 0xffffffffffffffff;
    local_278._12_4_ = 0xffffffff;
    local_288._8_4_ = 0xffffffff;
    local_288._0_8_ = 0xffffffffffffffff;
    local_288._12_4_ = 0xffffffff;
    local_338.ndata = (void *)0xffffffffffffffff;
    uStack_320 = 0xffffffffffffffff;
    local_338.magic[0] = 0xff;
    local_338.magic[1] = 0xff;
    local_338.magic[2] = 0xff;
    local_338.magic[3] = 0xff;
    local_338._4_4_ = 0xffffffff;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    auStack_150[0x18] = 0xf2;
    auStack_150[0x19] = '_';
    auStack_150[0x1a] = 0xd7;
    auStack_150[0x1b] = 0x88;
    auStack_150[0x1c] = 0x81;
    auStack_150[0x1d] = 0xeb;
    auStack_150[0x1e] = 0xb3;
    auStack_150[0x1f] = '\'';
    auStack_150[0x20] = 'q';
    auStack_150[0x21] = 0xfc;
    auStack_150[0x22] = 'Y';
    auStack_150[0x23] = '\"';
    auStack_150[0x24] = 0xef;
    auStack_150[0x25] = 0xc6;
    auStack_150[0x26] = 'n';
    auStack_150[0x27] = 0xa3;
    auStack_150[8] = 0x97;
    auStack_150[9] = 'X';
    auStack_150[10] = '+';
    auStack_150[0xb] = 0x9c;
    auStack_150[0xc] = 0xb1;
    auStack_150[0xd] = '=';
    auStack_150[0xe] = 0xb3;
    auStack_150[0xf] = 0x93;
    auStack_150[0x10] = '7';
    auStack_150[0x11] = '\x05';
    auStack_150[0x12] = 0xb3;
    auStack_150[0x13] = '+';
    auStack_150[0x14] = 0xa9;
    auStack_150[0x15] = 0x82;
    auStack_150[0x16] = 0xaf;
    auStack_150[0x17] = 'Z';
    local_158 = (void *)0xb651dd87a1c1ec65;
    auStack_150[0] = 'O';
    auStack_150[1] = 0xda;
    auStack_150[2] = '\x1e';
    auStack_150[3] = 0xdc;
    auStack_150[4] = 0x96;
    auStack_150[5] = '7';
    auStack_150[6] = 0xd5;
    auStack_150[7] = 0xec;
    local_168[0] = '~';
    local_168[1] = 0xb0;
    local_168[2] = 'P';
    local_168[3] = 0x97;
    local_168._4_4_ = 0xf146e257;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xb91c615156884994;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_228;
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    pubkey = &local_338;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145f87;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)pubkey_00,(uchar *)keypair,local_288,pubkey->magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x145fa0;
    test_schnorrsig_bip_vectors_check_verify((uchar *)keypair,pubkey->magic,0x20,local_168,1);
    local_218 = (void *)0xaae28b6d7430fa7d;
    auStack_210[0] = 'e';
    auStack_210[1] = 0x97;
    auStack_210[2] = '_';
    auStack_210[3] = ')';
    auStack_210[4] = 0xd2;
    auStack_210[5] = '-';
    auStack_210[6] = 199;
    auStack_210[7] = 0xb9;
    local_228._0_8_ = 0x12e499bb09359cd6;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
    local_388 = (secp256k1_nonce_function_hardened *)0x9b591ac87578f199;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    local_398 = (undefined1  [8])0xb283cc8ff6c3f34d;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x24a73104c9429d7e;
    auStack_150[0x18] = '`';
    auStack_150[0x19] = 0xcb;
    auStack_150[0x1a] = 'q';
    auStack_150[0x1b] = 0xc0;
    auStack_150[0x1c] = 'N';
    auStack_150[0x1d] = 0x80;
    auStack_150[0x1e] = 0xf5;
    auStack_150[0x1f] = 0x93;
    auStack_150[0x20] = '\x06';
    auStack_150[0x21] = '\v';
    auStack_150[0x22] = '\a';
    auStack_150[0x23] = 0xd2;
    auStack_150[0x24] = 0x83;
    auStack_150[0x25] = '\b';
    auStack_150[0x26] = 0xd7;
    auStack_150[0x27] = 0xf4;
    auStack_150[8] = 'v';
    auStack_150[9] = 0xaf;
    auStack_150[10] = 0xb1;
    auStack_150[0xb] = 'T';
    auStack_150[0xc] = 0x8a;
    auStack_150[0xd] = 0xf6;
    auStack_150[0xe] = '\x03';
    auStack_150[0xf] = 0xb3;
    auStack_150[0x10] = 0xeb;
    auStack_150[0x11] = 'E';
    auStack_150[0x12] = 0xc9;
    auStack_150[0x13] = 0xf8;
    auStack_150[0x14] = ' ';
    auStack_150[0x15] = '}';
    auStack_150[0x16] = 0xee;
    auStack_150[0x17] = '\x10';
    local_158 = (void *)0x28aaf51494eda089;
    auStack_150[0] = 0xad;
    auStack_150[1] = '\r';
    auStack_150[2] = 0x96;
    auStack_150[3] = 0xd6;
    auStack_150[4] = 'y';
    auStack_150[5] = '_';
    auStack_150[6] = 0x9c;
    auStack_150[7] = 'c';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168._4_4_ = 0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3f56ce783b000000;
    psVar156 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146021;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar156,local_398,0x20,local_168,1);
    local_218 = (void *)0x8776b979ae9898eb;
    auStack_210[0] = 'f';
    auStack_210[1] = 0xe4;
    auStack_210[2] = 0xfa;
    auStack_210[3] = 0xa0;
    auStack_210[4] = 'J';
    auStack_210[5] = '-';
    auStack_210[6] = 'J';
    auStack_210[7] = '4';
    local_228._0_8_ = 0x507767db4ceafdee;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146052;
    psVar148 = CTX;
    iVar143 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar143 != 0) goto LAB_001476a4;
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 'z';
    auStack_150[0x19] = 's';
    auStack_150[0x1a] = 0xc6;
    auStack_150[0x1b] = 'C';
    auStack_150[0x1c] = 0xe1;
    auStack_150[0x1d] = 'f';
    auStack_150[0x1e] = 0xbe;
    auStack_150[0x1f] = '^';
    auStack_150[0x20] = 0xbe;
    auStack_150[0x21] = 0xaf;
    auStack_150[0x22] = 0xa3;
    auStack_150[0x23] = 'K';
    auStack_150[0x24] = '\x1a';
    auStack_150[0x25] = 0xc5;
    auStack_150[0x26] = 'S';
    auStack_150[0x27] = 0xe2;
    auStack_150[8] = '<';
    auStack_150[9] = 0xc2;
    auStack_150[10] = 'y';
    auStack_150[0xb] = 'D';
    auStack_150[0xc] = 'd';
    auStack_150[0xd] = '\n';
    auStack_150[0xe] = 0xc6;
    auStack_150[0xf] = '\a';
    auStack_150[0x10] = 0xcd;
    auStack_150[0x11] = '\x10';
    auStack_150[0x12] = 'z';
    auStack_150[0x13] = 0xe1;
    auStack_150[0x14] = '\t';
    auStack_150[0x15] = '#';
    auStack_150[0x16] = 0xd9;
    auStack_150[0x17] = 0xef;
    local_158 = (void *)0x8ba168852f47f682;
    auStack_150[0] = '/';
    auStack_150[1] = '\x05';
    auStack_150[2] = 'z';
    auStack_150[3] = '\x14';
    auStack_150[4] = '`';
    auStack_150[5] = ')';
    auStack_150[6] = 'u';
    auStack_150[7] = 'V';
    local_168[0] = 0xff;
    local_168[1] = 0xf9;
    local_168[2] = '{';
    local_168[3] = 0xd5;
    local_168._4_4_ = 0xa4ee5e75;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xd3355235143a4520;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1460de;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 'b';
    auStack_150[0x19] = '*';
    auStack_150[0x1a] = 0x95;
    auStack_150[0x1b] = 'L';
    auStack_150[0x1c] = 0xfe;
    auStack_150[0x1d] = 'T';
    auStack_150[0x1e] = 'W';
    auStack_150[0x1f] = '5';
    auStack_150[0x20] = 0xaa;
    auStack_150[0x21] = 0xea;
    auStack_150[0x22] = 'Q';
    auStack_150[0x23] = '4';
    auStack_150[0x24] = 0xfc;
    auStack_150[0x25] = 0xcd;
    auStack_150[0x26] = 0xb2;
    auStack_150[0x27] = 0xbd;
    auStack_150[8] = '(';
    auStack_150[9] = 0x89;
    auStack_150[10] = '\v';
    auStack_150[0xb] = '>';
    auStack_150[0xc] = 0xdb;
    auStack_150[0xd] = 'n';
    auStack_150[0xe] = 'q';
    auStack_150[0xf] = 0x89;
    auStack_150[0x10] = 0xb6;
    auStack_150[0x11] = '0';
    auStack_150[0x12] = 'D';
    auStack_150[0x13] = 0x8b;
    auStack_150[0x14] = 'Q';
    auStack_150[0x15] = '\\';
    auStack_150[0x16] = 0xe4;
    auStack_150[0x17] = 0xf8;
    local_158 = (void *)0xf46f3fdf13b032b4;
    auStack_150[0] = 0xf9;
    auStack_150[1] = 0x9f;
    auStack_150[2] = 0xcb;
    auStack_150[3] = '3';
    auStack_150[4] = 0xe0;
    auStack_150[5] = 0xe1;
    auStack_150[6] = 'Q';
    auStack_150[7] = '_';
    local_168[0] = '\x1f';
    local_168[1] = 0xa6;
    local_168[2] = '.';
    local_168[3] = '3';
    local_168._4_4_ = 0x1cc2db1e;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xa70011abd2924739;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146162;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xe8;
    auStack_150[0x19] = 0xd7;
    auStack_150[0x1a] = 0xc9;
    auStack_150[0x1b] = '>';
    auStack_150[0x1c] = '\0';
    auStack_150[0x1d] = 0xc5;
    auStack_150[0x1e] = 0xed;
    auStack_150[0x1f] = '\f';
    auStack_150[0x20] = '\x18';
    auStack_150[0x21] = '4';
    auStack_150[0x22] = 0xff;
    auStack_150[0x23] = '\r';
    auStack_150[0x24] = '\f';
    auStack_150[0x25] = '.';
    auStack_150[0x26] = 'm';
    auStack_150[0x27] = 0xa6;
    auStack_150[8] = 0x96;
    auStack_150[9] = '\x17';
    auStack_150[10] = 'd';
    auStack_150[0xb] = 0xb3;
    auStack_150[0xc] = 0xaa;
    auStack_150[0xd] = 0x9b;
    auStack_150[0xe] = '/';
    auStack_150[0xf] = 0xfc;
    auStack_150[0x10] = 0xb6;
    auStack_150[0x11] = 0xef;
    auStack_150[0x12] = 0x94;
    auStack_150[0x13] = '{';
    auStack_150[0x14] = 'h';
    auStack_150[0x15] = 0x87;
    auStack_150[0x16] = 0xa2;
    auStack_150[0x17] = '&';
    local_158 = (void *)0x96d9b2896097c174;
    auStack_150[0] = '=';
    auStack_150[1] = 0xa2;
    auStack_150[2] = 0xe5;
    auStack_150[3] = 'T';
    auStack_150[4] = '>';
    auStack_150[5] = '\x17';
    auStack_150[6] = 'w';
    auStack_150[7] = 'i';
    local_168[0] = 'l';
    local_168[1] = 0xff;
    local_168[2] = '\\';
    local_168[3] = ';';
    local_168._4_4_ = 0xea696ca8;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1461e8;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 'O';
    auStack_150[0x19] = 0xb7;
    auStack_150[0x1a] = '4';
    auStack_150[0x1b] = 'v';
    auStack_150[0x1c] = 0xf0;
    auStack_150[0x1d] = 0xd5;
    auStack_150[0x1e] = 0x94;
    auStack_150[0x1f] = 0xdc;
    auStack_150[0x20] = 0xb6;
    auStack_150[0x21] = '\\';
    auStack_150[0x22] = 'd';
    auStack_150[0x23] = '%';
    auStack_150[0x24] = 0xbd;
    auStack_150[0x25] = '\x18';
    auStack_150[0x26] = '`';
    auStack_150[0x27] = 'Q';
    auStack_150[8] = '\x12';
    auStack_150[9] = '=';
    auStack_150[10] = 0xda;
    auStack_150[0xb] = 0x83;
    auStack_150[0xc] = '(';
    auStack_150[0xd] = 0xaf;
    auStack_150[0xe] = 0x9c;
    auStack_150[0xf] = '#';
    auStack_150[0x10] = 0xa9;
    auStack_150[0x11] = 'L';
    auStack_150[0x12] = '\x1f';
    auStack_150[0x13] = 0xee;
    auStack_150[0x14] = 0xcf;
    auStack_150[0x15] = 0xd1;
    auStack_150[0x16] = '#';
    auStack_150[0x17] = 0xba;
    local_158 = (void *)0x0;
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168._4_4_ = 0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14626e;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xdb;
    auStack_150[0x19] = 0xa8;
    auStack_150[0x1a] = '\x7f';
    auStack_150[0x1b] = '\x11';
    auStack_150[0x1c] = 0xac;
    auStack_150[0x1d] = 'g';
    auStack_150[0x1e] = 'T';
    auStack_150[0x1f] = 0xf9;
    auStack_150[0x20] = '7';
    auStack_150[0x21] = 0x80;
    auStack_150[0x22] = 0xd5;
    auStack_150[0x23] = 0xa1;
    auStack_150[0x24] = 0x83;
    auStack_150[0x25] = '|';
    auStack_150[0x26] = 0xf1;
    auStack_150[0x27] = 0x97;
    auStack_150[8] = 'v';
    auStack_150[9] = '\x15';
    auStack_150[10] = 0xfb;
    auStack_150[0xb] = 0xaf;
    auStack_150[0xc] = 'Z';
    auStack_150[0xd] = 0xe2;
    auStack_150[0xe] = 0x88;
    auStack_150[0xf] = 'd';
    auStack_150[0x10] = '\x01';
    auStack_150[0x11] = '<';
    auStack_150[0x12] = '\t';
    auStack_150[0x13] = 0x97;
    auStack_150[0x14] = 'B';
    auStack_150[0x15] = 0xde;
    auStack_150[0x16] = 0xad;
    auStack_150[0x17] = 0xb4;
    local_158 = (void *)0x0;
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\x01';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168._4_4_ = 0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1462f4;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xd1;
    auStack_150[0x19] = 0xd7;
    auStack_150[0x1a] = '\x13';
    auStack_150[0x1b] = 0xa8;
    auStack_150[0x1c] = 0xae;
    auStack_150[0x1d] = 0x82;
    auStack_150[0x1e] = 0xb3;
    auStack_150[0x1f] = '/';
    auStack_150[0x20] = 0xa7;
    auStack_150[0x21] = 0x9d;
    auStack_150[0x22] = '_';
    auStack_150[0x23] = '\x7f';
    auStack_150[0x24] = 0xc4;
    auStack_150[0x25] = '\a';
    auStack_150[0x26] = 0xd3;
    auStack_150[0x27] = 0x9b;
    auStack_150[8] = 'i';
    auStack_150[9] = 0xe8;
    auStack_150[10] = 0x9b;
    auStack_150[0xb] = 'L';
    auStack_150[0xc] = 'U';
    auStack_150[0xd] = 'd';
    auStack_150[0xe] = 0xd0;
    auStack_150[0xf] = '\x03';
    auStack_150[0x10] = 'I';
    auStack_150[0x11] = '\x10';
    auStack_150[0x12] = 'k';
    auStack_150[0x13] = 0x84;
    auStack_150[0x14] = 0x97;
    auStack_150[0x15] = 'x';
    auStack_150[0x16] = ']';
    auStack_150[0x17] = 0xd7;
    local_158 = (void *)0xc79b260f2ba84d56;
    auStack_150[0] = '\n';
    auStack_150[1] = 't';
    auStack_150[2] = 0xf8;
    auStack_150[3] = '\"';
    auStack_150[4] = '\x04';
    auStack_150[5] = ')';
    auStack_150[6] = 0xba;
    auStack_150[7] = '\x1d';
    local_168[0] = 'J';
    local_168[1] = ')';
    local_168[2] = 0x8d;
    local_168[3] = 0xac;
    local_168._4_4_ = 0x5a3957ae;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xcb1dfddb5d79d015;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14637a;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xd1;
    auStack_150[0x19] = 0xd7;
    auStack_150[0x1a] = '\x13';
    auStack_150[0x1b] = 0xa8;
    auStack_150[0x1c] = 0xae;
    auStack_150[0x1d] = 0x82;
    auStack_150[0x1e] = 0xb3;
    auStack_150[0x1f] = '/';
    auStack_150[0x20] = 0xa7;
    auStack_150[0x21] = 0x9d;
    auStack_150[0x22] = '_';
    auStack_150[0x23] = '\x7f';
    auStack_150[0x24] = 0xc4;
    auStack_150[0x25] = '\a';
    auStack_150[0x26] = 0xd3;
    auStack_150[0x27] = 0x9b;
    auStack_150[8] = 'i';
    auStack_150[9] = 0xe8;
    auStack_150[10] = 0x9b;
    auStack_150[0xb] = 'L';
    auStack_150[0xc] = 'U';
    auStack_150[0xd] = 'd';
    auStack_150[0xe] = 0xd0;
    auStack_150[0xf] = '\x03';
    auStack_150[0x10] = 'I';
    auStack_150[0x11] = '\x10';
    auStack_150[0x12] = 'k';
    auStack_150[0x13] = 0x84;
    auStack_150[0x14] = 0x97;
    auStack_150[0x15] = 'x';
    auStack_150[0x16] = ']';
    auStack_150[0x17] = 0xd7;
    local_158 = (void *)0xffffffffffffffff;
    auStack_150[0] = 0xff;
    auStack_150[1] = 0xff;
    auStack_150[2] = 0xff;
    auStack_150[3] = 0xfe;
    auStack_150[4] = 0xff;
    auStack_150[5] = 0xff;
    auStack_150[6] = 0xfc;
    auStack_150[7] = '/';
    local_168[0] = 0xff;
    local_168[1] = 0xff;
    local_168[2] = 0xff;
    local_168[3] = 0xff;
    local_168._4_4_ = 0xffffffff;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_168;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146400;
    test_schnorrsig_bip_vectors_check_verify(local_228,(uchar *)keypair,0x20,(uchar *)pubkey_00,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228._0_8_ = 0x5f1c672a7fd7f1df;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xba;
    auStack_150[0x19] = 0xae;
    auStack_150[0x1a] = 0xdc;
    auStack_150[0x1b] = 0xe6;
    auStack_150[0x1c] = 0xaf;
    auStack_150[0x1d] = 'H';
    auStack_150[0x1e] = 0xa0;
    auStack_150[0x1f] = ';';
    auStack_150[0x20] = 0xbf;
    auStack_150[0x21] = 0xd2;
    auStack_150[0x22] = '^';
    auStack_150[0x23] = 0x8c;
    auStack_150[0x24] = 0xd0;
    auStack_150[0x25] = '6';
    auStack_150[0x26] = 'A';
    auStack_150[0x27] = 'A';
    auStack_150[8] = 0xff;
    auStack_150[9] = 0xff;
    auStack_150[10] = 0xff;
    auStack_150[0xb] = 0xff;
    auStack_150[0xc] = 0xff;
    auStack_150[0xd] = 0xff;
    auStack_150[0xe] = 0xff;
    auStack_150[0xf] = 0xff;
    auStack_150[0x10] = 0xff;
    auStack_150[0x11] = 0xff;
    auStack_150[0x12] = 0xff;
    auStack_150[0x13] = 0xff;
    auStack_150[0x14] = 0xff;
    auStack_150[0x15] = 0xff;
    auStack_150[0x16] = 0xff;
    auStack_150[0x17] = 0xfe;
    local_158 = (void *)0x96d9b2896097c174;
    auStack_150[0] = '=';
    auStack_150[1] = 0xa2;
    auStack_150[2] = 0xe5;
    auStack_150[3] = 'T';
    auStack_150[4] = '>';
    auStack_150[5] = '\x17';
    auStack_150[6] = 'w';
    auStack_150[7] = 'i';
    local_168[0] = 'l';
    local_168[1] = 0xff;
    local_168[2] = '\\';
    local_168[3] = ';';
    local_168._4_4_ = 0xea696ca8;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psVar156 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146480;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar156,local_398,0x20,local_168,0);
    local_218 = (void *)0xffffffffffffffff;
    auStack_210[0] = 0xff;
    auStack_210[1] = 0xff;
    auStack_210[2] = 0xff;
    auStack_210[3] = 0xfe;
    auStack_210[4] = 0xff;
    auStack_210[5] = 0xff;
    auStack_210[6] = 0xfc;
    auStack_210[7] = '0';
    local_228._0_8_ = 0xffffffffffffffff;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1464b1;
    psVar148 = CTX;
    iVar143 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar143 != 0) goto LAB_001476a9;
    local_218 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_210,"\x03@\x03@\x03@\x03@",8);
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398[0] = 'w';
    local_398[1] = 0x8c;
    local_398[2] = 0xaa;
    local_398[3] = 'S';
    local_398._4_4_ = 0xc43a39b4;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    auStack_150[0x18] = 0x9f;
    auStack_150[0x19] = '-';
    auStack_150[0x1a] = 'V';
    auStack_150[0x1b] = '\x0f';
    auStack_150[0x1c] = 0xac;
    auStack_150[0x1d] = 'e';
    auStack_150[0x1e] = '(';
    auStack_150[0x1f] = '\'';
    auStack_150[0x20] = 0xd1;
    auStack_150[0x21] = 0xaf;
    auStack_150[0x22] = '\x05';
    auStack_150[0x23] = 't';
    auStack_150[0x24] = 0xe4;
    auStack_150[0x25] = '\'';
    auStack_150[0x26] = 0xab;
    auStack_150[0x27] = 'c';
    auStack_150[8] = '`';
    auStack_150[9] = 'i';
    auStack_150[10] = 0xce;
    auStack_150[0xb] = '&';
    auStack_150[0xc] = 0xbf;
    auStack_150[0xd] = '\x03';
    auStack_150[0xe] = 'F';
    auStack_150[0xf] = 'b';
    auStack_150[0x10] = '(';
    auStack_150[0x11] = 0xf1;
    auStack_150[0x12] = 0x9a;
    auStack_150[0x13] = ':';
    auStack_150[0x14] = 'b';
    auStack_150[0x15] = 0xdb;
    auStack_150[0x16] = 0x8a;
    auStack_150[0x17] = 'd';
    local_158 = (void *)0xccfc326743adb66b;
    auStack_150[0] = '%';
    auStack_150[1] = ')';
    auStack_150[2] = '\x1a';
    auStack_150[3] = 'U';
    auStack_150[4] = 0x89;
    auStack_150[5] = 'T';
    auStack_150[6] = 'd';
    auStack_150[7] = 0xcf;
    local_168[0] = 'q';
    local_168[1] = 'S';
    local_168[2] = ']';
    local_168[3] = 0xb1;
    local_168._4_4_ = 0xfbd9ec65;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x1861eafa5f6e04bc;
    local_290 = 0;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146561;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,(uchar *)0x0,0,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146576;
    test_schnorrsig_bip_vectors_check_verify(local_398,(uchar *)0x0,0,local_168,1);
    local_218 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_210,"\x03@\x03@\x03@\x03@",8);
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398[0] = 'w';
    local_398[1] = 0x8c;
    local_398[2] = 0xaa;
    local_398[3] = 'S';
    local_398._4_4_ = 0xc43a39b4;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
    local_338.magic[0] = '\x11';
    auStack_150[0x18] = 0xfe;
    auStack_150[0x19] = '|';
    auStack_150[0x1a] = 0xac;
    auStack_150[0x1b] = 0xfc;
    auStack_150[0x1c] = 'Z';
    auStack_150[0x1d] = 'W';
    auStack_150[0x1e] = '}';
    auStack_150[0x1f] = '3';
    auStack_150[0x20] = 0xec;
    auStack_150[0x21] = '\x14';
    auStack_150[0x22] = 'V';
    auStack_150[0x23] = 'L';
    auStack_150[0x24] = 0xec;
    auStack_150[0x25] = '+';
    auStack_150[0x26] = 0xac;
    auStack_150[0x27] = 0xbf;
    auStack_150[8] = 0xea;
    auStack_150[9] = '1';
    auStack_150[10] = 's';
    auStack_150[0xb] = 0xbf;
    auStack_150[0xc] = 0xea;
    auStack_150[0xd] = 'f';
    auStack_150[0xe] = 0x83;
    auStack_150[0xf] = 0xbd;
    auStack_150[0x10] = '\x10';
    auStack_150[0x11] = '\x1f';
    auStack_150[0x12] = 0xa5;
    auStack_150[0x13] = 0xaa;
    auStack_150[0x14] = ']';
    auStack_150[0x15] = 0xbc;
    auStack_150[0x16] = '\x19';
    auStack_150[0x17] = 0x96;
    local_158 = (void *)0x354c3be64a93b9b1;
    auStack_150[0] = '\x11';
    auStack_150[1] = 0xf3;
    auStack_150[2] = 0xae;
    auStack_150[3] = '\x11';
    auStack_150[4] = '4';
    auStack_150[5] = 0xc6;
    auStack_150[6] = 0xa3;
    auStack_150[7] = '\x03';
    local_168[0] = '\b';
    local_168[1] = 0xa2;
    local_168[2] = '\n';
    local_168[3] = '\n';
    local_168._4_4_ = 0x2441f6fe;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3a583c69e0329264;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146624;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338.magic,1,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14663d;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,1,local_168,1);
    local_218 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_210,"\x03@\x03@\x03@\x03@",8);
    local_228._0_8_ = 0x4003400340034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398[0] = 'w';
    local_398[1] = 0x8c;
    local_398[2] = 0xaa;
    local_398[3] = 'S';
    local_398._4_4_ = 0xc43a39b4;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = ZEXT816(0);
    local_288 = ZEXT816(0);
    local_338.ndata = (void *)CONCAT71(local_338.ndata._1_7_,0x11);
    builtin_memcpy(local_338.magic,"\x01\x02\x03\x04",4);
    local_338._4_4_ = 0x8070605;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
    auStack_150[0x18] = 0xe1;
    auStack_150[0x19] = 0xe5;
    auStack_150[0x1a] = 0xa3;
    auStack_150[0x1b] = '\x7f';
    auStack_150[0x1c] = 0xd8;
    auStack_150[0x1d] = '\x0e';
    auStack_150[0x1e] = 'Z';
    auStack_150[0x1f] = 'Q';
    auStack_150[0x20] = 0x89;
    auStack_150[0x21] = '|';
    auStack_150[0x22] = 'U';
    auStack_150[0x23] = 'f';
    auStack_150[0x24] = 0xa9;
    auStack_150[0x25] = '~';
    auStack_150[0x26] = 0xa5;
    auStack_150[0x27] = 0xa5;
    auStack_150[8] = 0xc4;
    auStack_150[9] = 0xa4;
    auStack_150[10] = 0x82;
    auStack_150[0xb] = 0xb7;
    auStack_150[0xc] = '{';
    auStack_150[0xd] = 0xf9;
    auStack_150[0xe] = '`';
    auStack_150[0xf] = 0xf8;
    auStack_150[0x10] = 'h';
    auStack_150[0x11] = '\x15';
    auStack_150[0x12] = '@';
    auStack_150[0x13] = 0xe2;
    auStack_150[0x14] = '[';
    auStack_150[0x15] = 'g';
    auStack_150[0x16] = 'q';
    auStack_150[0x17] = 0xec;
    local_158 = (void *)0x523c1ea7d199865d;
    auStack_150[0] = 0xda;
    auStack_150[1] = 0x9a;
    auStack_150[2] = 0xfd;
    auStack_150[3] = 0xb6;
    auStack_150[4] = 0xb5;
    auStack_150[5] = '\n';
    auStack_150[6] = 0xc3;
    auStack_150[7] = 'p';
    local_168[0] = 'Q';
    local_168[1] = '0';
    local_168[2] = 0xf3;
    local_168[3] = 0x9a;
    local_168._4_4_ = 0x3bb45940;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x2be5ec199ac0cac7;
    keypair = (secp256k1_schnorrsig_extraparams *)local_228;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1466f6;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)keypair,(uchar *)pubkey_00,local_288,local_338.magic,0x11,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14670f;
    test_schnorrsig_bip_vectors_check_verify((uchar *)pubkey_00,local_338.magic,0x11,local_168,1);
    local_388 = (secp256k1_nonce_function_hardened *)0x4003400340034003;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_398 = (undefined1  [8])0x4003400340034003;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_278._8_8_ = 0x17d16f4d32976408;
    local_278._0_8_ = 0x238be6f6b6faf94b;
    local_288._8_8_ = 0x22877a49094d7767;
    local_288._0_8_ = 0xc43a39b453aa8c77;
    local_338.ndata = (void *)0x0;
    uStack_320 = 0;
    local_338.magic[0] = '\0';
    local_338.magic[1] = '\0';
    local_338.magic[2] = '\0';
    local_338.magic[3] = '\0';
    local_338._4_4_ = 0;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x0;
    local_208.ndata = (void *)0xa0b4d0e9a0cb7f89;
    uStack_1f0 = 0x6723f249d2cf9468;
    local_208.magic[0] = 'X';
    local_208.magic[1] = '^';
    local_208.magic[2] = 0xd3;
    local_208.magic[3] = 0xe3;
    local_208._4_4_ = 0xe7070817;
    local_208.noncefp = (secp256k1_nonce_function_hardened)0x237b4cc50f723bc0;
    local_218 = (void *)0x6fbea8bf5d1e3203;
    auStack_210[0] = '\t';
    auStack_210[1] = '\x16';
    auStack_210[2] = '5';
    auStack_210[3] = '\x16';
    auStack_210[4] = '>';
    auStack_210[5] = 0xca;
    auStack_210[6] = 'y';
    auStack_210[7] = 0xa8;
    local_228._0_8_ = 0x345a55d8b0123b40;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
    auStack_150[0x38] = 0x99;
    auStack_150[0x39] = 0x99;
    auStack_150[0x3a] = 0x99;
    auStack_150[0x3b] = 0x99;
    auStack_150[0x3c] = 0x99;
    auStack_150[0x3d] = 0x99;
    auStack_150[0x3e] = 0x99;
    auStack_150[0x3f] = 0x99;
    auStack_150[0x40] = 0x99;
    auStack_150[0x41] = 0x99;
    auStack_150[0x42] = 0x99;
    auStack_150[0x43] = 0x99;
    auStack_150[0x44] = 0x99;
    auStack_150[0x45] = 0x99;
    auStack_150[0x46] = 0x99;
    auStack_150[0x47] = 0x99;
    auStack_150[0x28] = 0x99;
    auStack_150[0x29] = 0x99;
    auStack_150[0x2a] = 0x99;
    auStack_150[0x2b] = 0x99;
    auStack_150[0x2c] = 0x99;
    auStack_150[0x2d] = 0x99;
    auStack_150[0x2e] = 0x99;
    auStack_150[0x2f] = 0x99;
    auStack_150[0x30] = 0x99;
    auStack_150[0x31] = 0x99;
    auStack_150[0x32] = 0x99;
    auStack_150[0x33] = 0x99;
    auStack_150[0x34] = 0x99;
    auStack_150[0x35] = 0x99;
    auStack_150[0x36] = 0x99;
    auStack_150[0x37] = 0x99;
    auStack_150[0x18] = 0x99;
    auStack_150[0x19] = 0x99;
    auStack_150[0x1a] = 0x99;
    auStack_150[0x1b] = 0x99;
    auStack_150[0x1c] = 0x99;
    auStack_150[0x1d] = 0x99;
    auStack_150[0x1e] = 0x99;
    auStack_150[0x1f] = 0x99;
    auStack_150[0x20] = 0x99;
    auStack_150[0x21] = 0x99;
    auStack_150[0x22] = 0x99;
    auStack_150[0x23] = 0x99;
    auStack_150[0x24] = 0x99;
    auStack_150[0x25] = 0x99;
    auStack_150[0x26] = 0x99;
    auStack_150[0x27] = 0x99;
    auStack_150[8] = 0x99;
    auStack_150[9] = 0x99;
    auStack_150[10] = 0x99;
    auStack_150[0xb] = 0x99;
    auStack_150[0xc] = 0x99;
    auStack_150[0xd] = 0x99;
    auStack_150[0xe] = 0x99;
    auStack_150[0xf] = 0x99;
    auStack_150[0x10] = 0x99;
    auStack_150[0x11] = 0x99;
    auStack_150[0x12] = 0x99;
    auStack_150[0x13] = 0x99;
    auStack_150[0x14] = 0x99;
    auStack_150[0x15] = 0x99;
    auStack_150[0x16] = 0x99;
    auStack_150[0x17] = 0x99;
    local_158 = (void *)0x9999999999999999;
    auStack_150[0] = 0x99;
    auStack_150[1] = 0x99;
    auStack_150[2] = 0x99;
    auStack_150[3] = 0x99;
    auStack_150[4] = 0x99;
    auStack_150[5] = 0x99;
    auStack_150[6] = 0x99;
    auStack_150[7] = 0x99;
    local_168[0] = 0x99;
    local_168[1] = 0x99;
    local_168[2] = 0x99;
    local_168[3] = 0x99;
    local_168._4_4_ = 0x99999999;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x9999999999999999;
    local_108[0].magic[0] = 0x99;
    local_108[0].magic[1] = 0x99;
    local_108[0].magic[2] = 0x99;
    local_108[0].magic[3] = 0x99;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1467e0;
    test_schnorrsig_bip_vectors_check_signing
              (local_398,local_288,local_338.magic,local_168,100,local_228);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1467f9;
    test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,local_228,1);
    if (COUNT < 1) {
LAB_00147107:
      psVar165 = (secp256k1_schnorrsig_extraparams *)local_168;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      psVar156 = &local_338;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147117;
      testrand256(psVar156->magic);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14712e;
      psVar148 = CTX;
      iVar143 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,psVar156->magic);
      if (iVar143 == 0) goto LAB_001476ae;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147154;
      psVar148 = CTX;
      iVar143 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                           (secp256k1_keypair *)local_168);
      if (iVar143 == 0) goto LAB_001476b3;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147178;
      psVar148 = CTX;
      iVar143 = secp256k1_xonly_pubkey_serialize
                          (CTX,(uchar *)&(&local_2f8)[1].noncefp,(secp256k1_xonly_pubkey *)local_228
                          );
      if (iVar143 == 0) goto LAB_001476b8;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14719c;
      psVar148 = CTX;
      iVar143 = secp256k1_keypair_xonly_tweak_add
                          (CTX,(secp256k1_keypair *)local_168,(uchar *)&(&local_2f8)[1].noncefp);
      if (iVar143 != 1) goto LAB_001476bd;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1471c3;
      psVar148 = CTX;
      iVar143 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)local_398,(int *)&local_3b8,
                           (secp256k1_keypair *)local_168);
      if (iVar143 == 0) goto LAB_001476c2;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1471e4;
      psVar148 = CTX;
      iVar143 = secp256k1_xonly_pubkey_serialize
                          (CTX,local_2f8.magic,(secp256k1_xonly_pubkey *)local_398);
      if (iVar143 == 0) goto LAB_001476c7;
      psVar156 = (secp256k1_schnorrsig_extraparams *)local_3d8;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1471f9;
      testrand256((uchar *)psVar156);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14722c;
      psVar148 = CTX;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_288,(uchar *)psVar156,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar143 == 0) goto LAB_001476cc;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14724d;
      psVar148 = CTX;
      iVar143 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)local_398,local_2f8.magic);
      if (iVar143 == 0) goto LAB_001476d1;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147278;
      psVar148 = CTX;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,local_288,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_398);
      if (iVar143 == 0) goto LAB_001476d6;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14729c;
      psVar148 = CTX;
      iVar143 = secp256k1_xonly_pubkey_serialize
                          (CTX,local_2b8.magic,(secp256k1_xonly_pubkey *)local_228);
      if (iVar143 == 0) goto LAB_001476db;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1472c0;
      psVar148 = CTX;
      iVar143 = secp256k1_xonly_pubkey_parse
                          (CTX,(secp256k1_xonly_pubkey *)local_228,local_2b8.magic);
      if (iVar143 != 0) {
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1472f0;
        psVar148 = CTX;
        iVar143 = secp256k1_xonly_pubkey_tweak_add_check
                            (CTX,local_2f8.magic,(int)local_3b8.magic,
                             (secp256k1_xonly_pubkey *)local_228,(uchar *)&(&local_2f8)[1].noncefp);
        if (iVar143 != 0) {
          return;
        }
        goto LAB_001476e5;
      }
      goto LAB_001476e0;
    }
    keypair = (secp256k1_schnorrsig_extraparams *)local_288;
    while( true ) {
      psVar165 = (secp256k1_schnorrsig_extraparams *)local_168;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      psVar156 = &local_2b8;
      unaff_RBP = nonce_function_bip340;
      local_2f8.ndata = (void *)0x6e68637320612072;
      uStack_2e0 = 0x2e2e67697372726f;
      builtin_memcpy(local_2f8.magic,"this",4);
      local_2f8._4_4_ = 0x20736920;
      local_2f8.noncefp = (secp256k1_nonce_function_hardened)0x6f662067736d2061;
      local_308 = 0;
      uStack_300 = 0;
      local_318 = 0;
      uStack_310 = 0;
      local_338.ndata = (void *)0x0;
      uStack_320 = 0;
      local_338.magic[0] = '\0';
      local_338.magic[1] = '\0';
      local_338.magic[2] = '\0';
      local_338.magic[3] = '\0';
      local_338._4_4_ = 0;
      local_338.noncefp = (secp256k1_nonce_function_hardened)0x0;
      auVar131._8_8_ = 0;
      auVar131._0_8_ = local_3c8._8_8_;
      local_3c8 = auVar131 << 0x40;
      local_3d8 = ZEXT816(0x8cb36fda);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146880;
      testrand256(psVar156->magic);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14688d;
      testrand256((uchar *)&(&local_2f8)[1].noncefp);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14689f;
      iVar143 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar165,psVar156->magic);
      if (iVar143 == 0) break;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1468bb;
      iVar143 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                           (secp256k1_keypair *)psVar165);
      pcVar147 = (code *)psVar165;
      if (iVar143 == 0) goto LAB_00147323;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
      pcVar147 = (code *)&local_2f8;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1468f5;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_keypair *)psVar165,nonce_function_bip340,(void *)0x0);
      if (iVar143 == 0) goto LAB_00147328;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146917;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar143 == 0) goto LAB_0014732d;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146949;
      psVar148 = CTX;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)pcVar147,0x20,
                           (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
      if (iVar143 == 0) goto LAB_00147332;
      lVar146 = 0;
      psVar156 = (secp256k1_schnorrsig_extraparams *)local_3d8;
      do {
        psVar165 = (secp256k1_schnorrsig_extraparams *)pcVar147;
        if (local_398[lVar146] != local_288[lVar146]) goto LAB_001476ea;
        lVar146 = lVar146 + 1;
      } while (lVar146 != 0x40);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146999;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_keypair *)local_168,psVar156);
      if (iVar143 == 0) goto LAB_00147337;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1469bb;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar143 == 0) goto LAB_0014733c;
      local_368._8_8_ = 0x101010101010101;
      local_368._0_8_ = 0x101010101010101;
      local_378 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_370,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_388 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_failing;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146a1a;
      psVar148 = CTX;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_keypair *)local_168,psVar156);
      if (iVar143 != 0) goto LAB_00147341;
      lVar146 = 0;
      psVar165 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        if (local_398[lVar146] != local_338.magic[lVar146]) goto LAB_001476ef;
        lVar146 = lVar146 + 1;
      } while (lVar146 != 0x40);
      local_368._8_8_ = 0x101010101010101;
      local_368._0_8_ = 0x101010101010101;
      local_378 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_370,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_388 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_0;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146a9d;
      psVar148 = CTX;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)pcVar147,0x20,(secp256k1_keypair *)psVar165,
                           psVar156);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)pcVar147;
      if (iVar143 != 0) goto LAB_00147346;
      lVar146 = 0;
      do {
        psVar155 = psVar156;
        if (local_398[lVar146] != local_338.magic[lVar146]) goto LAB_001476f4;
        lVar146 = lVar146 + 1;
      } while (lVar146 != 0x40);
      local_368._8_8_ = 0x101010101010101;
      local_368._0_8_ = 0x101010101010101;
      local_378 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_370,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_388 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_overflowing;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146b1b;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_keypair *)psVar165,psVar156);
      if (iVar143 == 0) goto LAB_0014734b;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146b3d;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar143 == 0) goto LAB_00147350;
      local_3d8._8_8_ = 0;
      local_3c8._0_8_ = &(&local_2f8)[1].noncefp;
      psVar155 = (secp256k1_schnorrsig_extraparams *)local_168;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146b80;
      iVar143 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)pubkey_00,(uchar *)pcVar147,0x20,
                           (secp256k1_keypair *)psVar155,psVar156);
      if (iVar143 == 0) goto LAB_00147355;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146bb1;
      psVar148 = CTX;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)pcVar147,0x20,(secp256k1_keypair *)psVar155
                           ,nonce_function_bip340,(void *)local_3c8._0_8_);
      pubkey_00 = keypair;
      if (iVar143 == 0) goto LAB_0014735a;
      lVar146 = 0;
      psVar155 = &local_338;
      do {
        if (local_398[lVar146] != local_288[lVar146]) goto LAB_001476f9;
        lVar146 = lVar146 + 1;
      } while (lVar146 != 0x40);
      pcVar147 = (code *)&local_2b8;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146bed;
      testrand256((uchar *)pcVar147);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146bff;
      iVar143 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,(uchar *)pcVar147);
      if (iVar143 == 0) goto LAB_0014735f;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146c1b;
      iVar143 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)psVar155,(int *)0x0,
                           (secp256k1_keypair *)keypair);
      if (iVar143 == 0) goto LAB_00147364;
      psVar165 = (secp256k1_schnorrsig_extraparams *)0x0;
      pubkey_00 = pubkey;
      do {
        pubkey = (secp256k1_schnorrsig_extraparams *)(local_398 + (long)psVar165);
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146c39;
        testrand256((uchar *)pubkey);
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146c5e;
        iVar143 = secp256k1_schnorrsig_sign_internal
                            (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,(secp256k1_keypair *)keypair,
                             nonce_function_bip340,(void *)0x0);
        if (iVar143 == 0) {
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14730f;
          run_schnorrsig_tests_cold_66();
LAB_0014730f:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147314;
          run_schnorrsig_tests_cold_65();
LAB_00147314:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147319;
          run_schnorrsig_tests_cold_97();
          psVar156 = psVar155;
LAB_00147319:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14731e;
          run_schnorrsig_tests_cold_95();
          goto LAB_0014731e;
        }
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146c80;
        iVar143 = secp256k1_schnorrsig_verify
                            (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,
                             (secp256k1_xonly_pubkey *)psVar155);
        if (iVar143 == 0) goto LAB_0014730f;
        psVar165 = (secp256k1_schnorrsig_extraparams *)&psVar165[1].noncefp;
        pubkey_00 = (secp256k1_schnorrsig_extraparams *)&pubkey_00[2].ndata;
      } while (psVar165 != (secp256k1_schnorrsig_extraparams *)0x60);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146ca0;
      uVar144 = testrand_int(3);
      uVar166 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar158 = secp256k1_test_state[1] << 0x11;
      uVar161 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar153 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar161;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar153;
      secp256k1_test_state[2] = uVar161 ^ uVar158;
      secp256k1_test_state[3] = uVar153 << 0x2d | uVar153 >> 0x13;
      pcVar147 = (code *)(uVar166 >> 0x3b);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146d0d;
      uVar145 = testrand_int(0xfe);
      pubkey = (secp256k1_schnorrsig_extraparams *)(local_228 + (ulong)uVar144 * 0x40);
      bVar169 = (char)uVar145 + 1;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(ulong)CONCAT31((int3)(uVar145 >> 8),bVar169);
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic] ^ bVar169;
      unaff_RBP = (code *)(local_398 + (ulong)uVar144 * 0x20);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146d4f;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 != 0) goto LAB_00147369;
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic] ^ bVar169;
      uVar166 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar158 = secp256k1_test_state[1] << 0x11;
      uVar161 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar153 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar161;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar153;
      secp256k1_test_state[2] = uVar161 ^ uVar158;
      secp256k1_test_state[3] = uVar153 << 0x2d | uVar153 >> 0x13;
      pcVar147 = (code *)(uVar166 >> 0x3b);
      pbVar1 = (byte *)((long)&((secp256k1_schnorrsig_extraparams *)((long)pcVar147 + 0x18))->
                               noncefp + (long)pubkey);
      *pbVar1 = *pbVar1 ^ bVar169;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146dde;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 != 0) goto LAB_0014736e;
      (((secp256k1_schnorrsig_extraparams *)pcVar147)->magic + (long)pubkey->magic)[0x20] =
           (((secp256k1_schnorrsig_extraparams *)pcVar147)->magic + (long)pubkey->magic)[0x20] ^
           bVar169;
      uVar166 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar158 = secp256k1_test_state[1] << 0x11;
      uVar161 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar153 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar161;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar153;
      secp256k1_test_state[2] = uVar161 ^ uVar158;
      secp256k1_test_state[3] = uVar153 << 0x2d | uVar153 >> 0x13;
      pcVar147 = (code *)(uVar166 >> 0x3b);
      ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
      [(long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic] =
           ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
           [(long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic] ^ bVar169;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146e71;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 != 0) goto LAB_00147373;
      pcVar147 = (code *)(((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic +
                         (long)((secp256k1_schnorrsig_extraparams *)pcVar147)->magic);
      ((secp256k1_schnorrsig_extraparams *)pcVar147)->magic[0] =
           ((secp256k1_schnorrsig_extraparams *)pcVar147)->magic[0] ^ bVar169;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146e9a;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 == 0) goto LAB_00147378;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      unaff_RBP = (code *)local_398;
      pcVar147 = nonce_function_bip340;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146edb;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar143 == 0) goto LAB_0014737d;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146efd;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 == 0) goto LAB_00147382;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(auStack_210 + 8);
      local_208.ndata = (void *)0xffffffffffffffff;
      uStack_1f0 = 0xffffffffffffffff;
      local_208.magic[0] = 0xff;
      local_208.magic[1] = 0xff;
      local_208.magic[2] = 0xff;
      local_208.magic[3] = 0xff;
      local_208._4_4_ = 0xffffffff;
      local_208.noncefp = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146f36;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 != 0) goto LAB_00147387;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146f63;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar143 == 0) goto LAB_0014738c;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146f85;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 == 0) goto LAB_00147391;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146fa2;
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_2f8,(uchar *)pubkey_00,(int *)0x0);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146fad;
      secp256k1_scalar_negate((secp256k1_scalar *)&local_2f8,(secp256k1_scalar *)&local_2f8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146fb8;
      secp256k1_scalar_get_b32((uchar *)pubkey_00,(secp256k1_scalar *)&local_2f8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146fd2;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar155);
      pcVar147 = (code *)&local_2f8;
      psVar156 = keypair;
      if (iVar143 != 0) goto LAB_00147396;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146ffe;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_keypair *)keypair,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar143 == 0) goto LAB_0014739b;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14701c;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar155);
      if (iVar143 == 0) goto LAB_001473a0;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14702e;
      uVar144 = testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar144;
      uVar153 = 0xffffffffffffffe0;
      psVar155 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14704c;
        testrand256(auStack_150 + uVar153 + 8);
        uVar153 = uVar153 + 0x20;
      } while (uVar153 < 0xe0);
      psVar165 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar144;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14707f;
      iVar143 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)psVar155,(size_t)psVar165,
                           (secp256k1_keypair *)keypair,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      pubkey_00 = psVar165;
      if (iVar143 == 0) goto LAB_001473a5;
      pubkey_00 = &local_338;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1470a7;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar155,(size_t)psVar165,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar143 == 0) goto LAB_001473aa;
      unaff_RBP = (code *)(ulong)(uVar144 - 1);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1470ca;
      iVar143 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar155,(ulong)unaff_RBP & 0xff,
                           (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar143 != 0) goto LAB_001473af;
      uVar154 = (int)local_290 + 1;
      local_290 = (ulong)uVar154;
      unaff_RBP = nonce_function_bip340;
      if (COUNT <= (int)uVar154) goto LAB_00147107;
    }
LAB_0014731e:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147323;
    run_schnorrsig_tests_cold_79();
    pcVar147 = (code *)psVar165;
LAB_00147323:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147328;
    run_schnorrsig_tests_cold_78();
LAB_00147328:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14732d;
    run_schnorrsig_tests_cold_77();
LAB_0014732d:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147332;
    run_schnorrsig_tests_cold_76();
LAB_00147332:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147337;
    run_schnorrsig_tests_cold_75();
LAB_00147337:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14733c;
    run_schnorrsig_tests_cold_74();
LAB_0014733c:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147341;
    run_schnorrsig_tests_cold_73();
LAB_00147341:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147346;
    run_schnorrsig_tests_cold_33();
    psVar165 = (secp256k1_schnorrsig_extraparams *)pcVar147;
LAB_00147346:
    pcVar147 = (code *)psVar165;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14734b;
    run_schnorrsig_tests_cold_35();
LAB_0014734b:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147350;
    run_schnorrsig_tests_cold_72();
    psVar155 = psVar156;
LAB_00147350:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147355;
    run_schnorrsig_tests_cold_71();
LAB_00147355:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14735a;
    run_schnorrsig_tests_cold_70();
LAB_0014735a:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14735f;
    run_schnorrsig_tests_cold_69();
LAB_0014735f:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147364;
    run_schnorrsig_tests_cold_68();
LAB_00147364:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147369;
    run_schnorrsig_tests_cold_67();
LAB_00147369:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14736e;
    run_schnorrsig_tests_cold_38();
LAB_0014736e:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147373;
    run_schnorrsig_tests_cold_39();
LAB_00147373:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147378;
    run_schnorrsig_tests_cold_40();
LAB_00147378:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14737d;
    run_schnorrsig_tests_cold_64();
LAB_0014737d:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147382;
    run_schnorrsig_tests_cold_63();
LAB_00147382:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147387;
    run_schnorrsig_tests_cold_62();
LAB_00147387:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14738c;
    run_schnorrsig_tests_cold_41();
LAB_0014738c:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147391;
    run_schnorrsig_tests_cold_61();
LAB_00147391:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147396;
    run_schnorrsig_tests_cold_60();
    psVar156 = keypair;
LAB_00147396:
    keypair = (secp256k1_schnorrsig_extraparams *)pcVar147;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14739b;
    run_schnorrsig_tests_cold_42();
LAB_0014739b:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473a0;
    run_schnorrsig_tests_cold_59();
LAB_001473a0:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473a5;
    run_schnorrsig_tests_cold_58();
LAB_001473a5:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473aa;
    run_schnorrsig_tests_cold_57();
LAB_001473aa:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473af;
    run_schnorrsig_tests_cold_56();
LAB_001473af:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473b4;
    run_schnorrsig_tests_cold_43();
    psVar165 = keypair;
    keypair = psVar156;
LAB_001473b4:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473b9;
    run_schnorrsig_tests_cold_96();
LAB_001473b9:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473be;
    run_schnorrsig_tests_cold_94();
LAB_001473be:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473c3;
    run_schnorrsig_tests_cold_99();
    pcVar147 = (code *)psVar165;
LAB_001473c3:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473c8;
    run_schnorrsig_tests_cold_98();
LAB_001473c8:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473cd;
    run_schnorrsig_tests_cold_93();
    psVar156 = psVar155;
LAB_001473cd:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473d2;
    run_schnorrsig_tests_cold_92();
LAB_001473d2:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473d7;
    run_schnorrsig_tests_cold_91();
LAB_001473d7:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473dc;
    run_schnorrsig_tests_cold_90();
LAB_001473dc:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473e1;
    run_schnorrsig_tests_cold_89();
LAB_001473e1:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473e6;
    run_schnorrsig_tests_cold_88();
LAB_001473e6:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473eb;
    run_schnorrsig_tests_cold_87();
LAB_001473eb:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473f0;
    run_schnorrsig_tests_cold_86();
LAB_001473f0:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473f5;
    run_schnorrsig_tests_cold_85();
    psVar148 = extraout_RAX;
LAB_001473f5:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147409;
    (*(psVar148->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar148->illegal_callback).data);
    psVar148 = CTX;
    psVar165 = (secp256k1_schnorrsig_extraparams *)pcVar147;
  } while( true );
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}